

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::Marray
          (Marray<unsigned_char,_std::allocator<unsigned_long>_> *this,uchar *value,
          CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  CoordinateOrder CVar1;
  size_t sVar2;
  uchar *puVar3;
  void *pvVar4;
  unsigned_long *puVar5;
  runtime_error *this_00;
  
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.shape_ =
       (size_t *)0x0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.shapeStrides_ =
       (size_t *)0x0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.strides_ =
       (size_t *)0x0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ = 0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.size_ = 0;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
  coordinateOrder_ = LastMajorOrder;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ =
       true;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  puVar3 = (uchar *)operator_new(1);
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).data_ = puVar3;
  *puVar3 = *value;
  pvVar4 = operator_new(0);
  CVar1 = *coordinateOrder;
  sVar2 = (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
          dimension_;
  if (sVar2 != 0) {
    operator_delete((this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).
                    geometry_.shape_,sVar2 * 0x18);
    (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
         0;
    puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)
                        &(this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).
                         geometry_,0,(void *)0x0);
    (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.shape_ =
         puVar5;
    sVar2 = (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
            dimension_;
    (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.shapeStrides_
         = puVar5 + sVar2;
    (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.strides_ =
         puVar5 + sVar2 + sVar2;
    (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
         0;
  }
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.size_ = 1;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
  coordinateOrder_ = CVar1;
  (this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ =
       true;
  operator_delete(pvVar4,0);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if ((this->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_
      != false) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(1);
    this->data_[0] = value;
    this->geometry_ = geometry_type(0, coordinateOrder, 1, true, allocator);
    testInvariant();
}